

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O0

void run_fdtd(fdtd *fdtd,float_type end_time,_Bool verbose)

{
  int iVar1;
  int *in_RDI;
  _Bool in_stack_00000057;
  float_type in_stack_00000058;
  fdtd3D *in_stack_00000060;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    run_1D_fdtd((fdtd1D *)in_stack_00000060,in_stack_00000058,in_stack_00000057);
  }
  else if (iVar1 == 1) {
    run_2D_fdtd((fdtd2D *)in_stack_00000060,in_stack_00000058,in_stack_00000057);
  }
  else if (iVar1 == 2) {
    run_3D_fdtd(in_stack_00000060,in_stack_00000058,in_stack_00000057);
  }
  return;
}

Assistant:

inline void run_fdtd(struct fdtd *fdtd, float_type end_time, bool verbose) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    run_1D_fdtd(&fdtd->oneDim, end_time, verbose);
    break;
  case fdtd_two_dims:
    run_2D_fdtd(&fdtd->twoDims, end_time, verbose);
    break;
  case fdtd_three_dims:
    run_3D_fdtd(&fdtd->threeDims, end_time, verbose);
    break;
  }
}